

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O3

int lws_check_deferred_free(lws_context *context,int tsi,int force)

{
  lws_vhost *plVar1;
  lws_vhost *plVar2;
  lws *wsi;
  uint uVar3;
  
  plVar1 = context->vhost_list;
  while (plVar2 = plVar1, plVar2 != (lws_vhost *)0x0) {
    plVar1 = plVar2->vhost_next;
    if (((plVar2->field_0x2b4 & 4) != 0) &&
       (*(int *)((long)&context->set + (long)tsi * 0x188 + -0x50) != 0)) {
      uVar3 = 0;
      do {
        wsi = wsi_from_fd(context,context->pt[tsi].fds[(int)uVar3].fd);
        if ((wsi != (lws *)0x0) && (wsi->vhost == plVar2)) {
          __lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS_CONTEXT_DESTROY,"vh destroy");
          uVar3 = uVar3 - 1;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < *(uint *)((long)&context->set + (long)tsi * 0x188 + -0x50));
    }
  }
  return 0;
}

Assistant:

int
lws_check_deferred_free(struct lws_context *context, int tsi, int force)
{
	struct lws_context_per_thread *pt;
	int n;

	/*
	 * If we see a vhost is being destroyed, forcibly close every wsi on
	 * this tsi associated with this vhost.  That will include the listen
	 * socket if it is still associated with the closing vhost.
	 *
	 * For SMP, we do this once per tsi per destroyed vhost.  The reference
	 * counting on the vhost as the bound wsi close will notice that there
	 * are no bound wsi left, that vhost destruction can complete,
	 * and perform it.  It doesn't matter which service thread does that
	 * because there is nothing left using the vhost to conflict.
	 */

	lws_context_lock(context, "check deferred free"); /* ------ context { */

	lws_start_foreach_ll_safe(struct lws_vhost *, v, context->vhost_list, vhost_next) {
		if (v->being_destroyed
#if LWS_MAX_SMP > 1
			&& !v->close_flow_vs_tsi[tsi]
#endif
		) {

			pt = &context->pt[tsi];

			lws_pt_lock(pt, "vhost removal"); /* -------------- pt { */

#if LWS_MAX_SMP > 1
			v->close_flow_vs_tsi[tsi] = 1;
#endif

			for (n = 0; (unsigned int)n < pt->fds_count; n++) {
				struct lws *wsi = wsi_from_fd(context, pt->fds[n].fd);
				if (!wsi)
					continue;
				if (wsi->vhost != v)
					continue;

				__lws_close_free_wsi(wsi,
					LWS_CLOSE_STATUS_NOSTATUS_CONTEXT_DESTROY,
					"vh destroy"
					/* no protocol close */);
				n--;
			}

			lws_pt_unlock(pt); /* } pt -------------- */
		}
	} lws_end_foreach_ll_safe(v);


	lws_context_unlock(context); /* } context ------------------- */

	return 0;
}